

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Selector.cpp
# Opt level: O2

void __thiscall mognetwork::Selector::Selector(Selector *this)

{
  this->_vptr_Selector = (_func_int **)&PTR__Selector_00114a90;
  this->m_timeout = (Time *)0x0;
  (this->m_readSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_readSockets;
  (this->m_readSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_readSockets;
  (this->m_readSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->m_writeSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_writeSockets;
  (this->m_writeSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_writeSockets;
  (this->m_writeSockets).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->m_readUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_readUpdated;
  (this->m_readUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_readUpdated;
  (this->m_readUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  (this->m_writeUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_prev = (_List_node_base *)&this->m_writeUpdated;
  (this->m_writeUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node.
  super__List_node_base._M_next = (_List_node_base *)&this->m_writeUpdated;
  (this->m_writeUpdated).super__List_base<int,_std::allocator<int>_>._M_impl._M_node._M_size = 0;
  this->m_maxFds = 0;
  return;
}

Assistant:

Selector::Selector() : m_timeout(NULL), m_maxFds(0) {}